

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void envy_bios_print_mem_train_ptrn(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  uint uVar2;
  uint8_t mod;
  uint16_t off;
  uint32_t mask_1;
  uint32_t p_bits;
  uint8_t bits;
  uint uStack_34;
  uint16_t data_off;
  uint32_t idx;
  uint32_t data;
  int j;
  int i;
  envy_bios_mem_train_ptrn *mtp;
  FILE *pFStack_18;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  _j = &(bios->mem).train_ptrn;
  if ((_j->offset != 0) && ((mask & 0x1000) != 0)) {
    mtp._4_4_ = mask;
    pFStack_18 = (FILE *)out;
    out_local = (FILE *)bios;
    fprintf((FILE *)out,"MEM TRAIN PATTERN table at 0x%x, version %x\n",(ulong)_j->offset,
            (ulong)(bios->mem).train_ptrn.version);
    envy_bios_dump_hex((envy_bios *)out_local,(FILE *)pFStack_18,(uint)_j->offset,(uint)_j->hlen,
                       mtp._4_4_);
    if ((mtp._4_4_ & 0x80000000) != 0) {
      fprintf(pFStack_18,"\n");
    }
    for (data = 0; (int)data < (int)(uint)_j->entriesnum; data = data + 1) {
      fprintf(pFStack_18,"Set %2i: %u bits, modulo %u",(ulong)data,
              (ulong)_j->entries[(int)data].bits,(ulong)_j->entries[(int)data].modulo);
      if (_j->entries[(int)data].indirect == '\0') {
        mask_1._2_2_ = _j->entries[(int)data].offset;
        mask_1._1_1_ = _j->entries[(int)data].bits;
        fprintf(pFStack_18,". direct(%2d)\n",(ulong)_j->entries[(int)data].indirect_entry);
      }
      else {
        mask_1._2_2_ = _j->entries[_j->entries[(int)data].indirect_entry].offset;
        mask_1._1_1_ = _j->entries[_j->entries[(int)data].indirect_entry].bits;
        fprintf(pFStack_18,". indirect(%2d)\n",(ulong)_j->entries[(int)data].indirect_entry);
      }
      envy_bios_dump_hex((envy_bios *)out_local,(FILE *)pFStack_18,
                         (uint)_j->entries[(int)data].offset,(uint)_j->rlen,mtp._4_4_);
      if ((mtp._4_4_ & 0x80000000) != 0) {
        fprintf(pFStack_18,"\n");
      }
      for (idx = 0; (int)idx < (int)(uint)_j->entries[(int)data].modulo; idx = idx + 1) {
        if (_j->entries[(int)data].indirect == '\0') {
          p_bits = idx;
        }
        else {
          uVar2 = idx * _j->entries[(int)data].bits;
          bVar1 = _j->entries[(int)data].bits;
          bios_u32((envy_bios *)out_local,
                   (uint)_j->entries[(int)data].offset + (uint)_j->rlen + (uVar2 >> 3 & 0xffff),
                   &p_bits);
          p_bits = p_bits >> ((byte)uVar2 & 7) & (int)(1L << (bVar1 & 0x3f)) - 1U;
        }
        uVar2 = p_bits * mask_1._1_1_;
        bios_u32((envy_bios *)out_local,(uint)mask_1._2_2_ + (uint)_j->rlen + (uVar2 >> 3 & 0xffff),
                 &stack0xffffffffffffffcc);
        uStack_34 = uStack_34 >> ((byte)uVar2 & 7) & (int)(1L << (mask_1._1_1_ & 0x3f)) - 1U;
        fprintf(pFStack_18,"  %2u: [%08x]\n",(ulong)p_bits,(ulong)uStack_34);
      }
      fprintf(pFStack_18,"\n");
    }
  }
  return;
}

Assistant:

void
envy_bios_print_mem_train_ptrn(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem_train_ptrn *mtp = &bios->mem.train_ptrn;
	int i, j;
	uint32_t data, idx;
	uint16_t data_off;
	uint8_t bits;

	if (!mtp->offset || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "MEM TRAIN PATTERN table at 0x%x, version %x\n", mtp->offset, mtp->version);
	envy_bios_dump_hex(bios, out, mtp->offset, mtp->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < mtp->entriesnum; i++) {
		data_off = mtp->entries[i].offset;
		bits = mtp->entries[i].bits;
		fprintf(out, "Set %2i: %u bits, modulo %u", i, mtp->entries[i].bits, mtp->entries[i].modulo);
		if (mtp->entries[i].indirect) {
			data_off = mtp->entries[mtp->entries[i].indirect_entry].offset;
			bits = mtp->entries[mtp->entries[i].indirect_entry].bits;
			fprintf(out, ". indirect(%2d)\n", mtp->entries[i].indirect_entry);
		} else {
			data_off = mtp->entries[i].offset;
			bits = mtp->entries[i].bits;
			fprintf(out, ". direct(%2d)\n", mtp->entries[i].indirect_entry);
		}
		envy_bios_dump_hex(bios, out, mtp->entries[i].offset, mtp->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

		for (j = 0; j < mtp->entries[i].modulo; j++) {
			uint32_t p_bits;
			uint32_t mask;
			uint16_t off;
			uint8_t  mod;

			if (mtp->entries[i].indirect) {
				p_bits = j * mtp->entries[i].bits;
				mask = (1ULL << mtp->entries[i].bits) - 1;
				off = p_bits / 8;
				mod = p_bits % 8;

				bios_u32(bios, mtp->entries[i].offset + mtp->rlen + off, &idx);
				idx = idx >> mod;
				idx = idx & mask;
			} else {
				idx = j;
			}

			p_bits = idx * bits;
			mask = (1ULL << bits) - 1;
			off = p_bits / 8;
			mod = p_bits % 8;

			bios_u32(bios, data_off + mtp->rlen + off, &data);
			data = data >> mod;
			data = data & mask;

			fprintf(out, "  %2u: [%08x]\n", idx, data);
		}
		fprintf(out, "\n");
	}

}